

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O3

void deqp::gls::FboUtil::logField(TestLog *log,string *field,string *value)

{
  ostringstream *this;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  this = (ostringstream *)(local_198 + 8);
  local_198._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,(field->_M_dataplus)._M_p,field->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,": ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,(value->_M_dataplus)._M_p,value->_M_string_length);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

static void logField (TestLog& log, const string& field, const string& value)
{
	log << TestLog::Message << field << ": " << value << TestLog::EndMessage;
}